

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

void define_one_arm_cp_reg_with_opaque_arm(ARMCPU *cpu,ARMCPRegInfo *r,void *opaque)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  uint opc2;
  uint crm;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  char *pcVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  bool bVar12;
  
  crm = (uint)r->crm;
  uVar4 = (uint)r->crm;
  if (uVar4 == 0xff) {
    uVar4 = 0xf;
    crm = 0;
  }
  bVar1 = r->opc1;
  uVar9 = (uint)bVar1;
  uVar5 = uVar9;
  if (uVar9 == 0xff) {
    uVar5 = 0;
  }
  uVar10 = (uint)bVar1;
  if (uVar9 == 0xff) {
    uVar10 = 7;
  }
  bVar2 = r->opc2;
  uVar11 = (uint)bVar2;
  uVar9 = 0;
  if (uVar11 != 0xff) {
    uVar9 = uVar11;
  }
  uVar6 = 7;
  if (uVar11 != 0xff) {
    uVar6 = (uint)bVar2;
  }
  uVar11 = r->type;
  if (((uVar11 & 4) != 0) && ((bVar2 != 0 || (r->crn != '\0')))) {
    __assert_fail("!((r->type & ARM_CP_64BIT) && (r->opc2 || r->crn))",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/helper.c"
                  ,0x1de9,
                  "void define_one_arm_cp_reg_with_opaque_arm(ARMCPU *, const ARMCPRegInfo *, void *)"
                 );
  }
  if (r->state == 1) {
    if ((uVar11 & 4) != 0) {
      __assert_fail("(r->state != ARM_CP_STATE_AA64) || !(r->type & ARM_CP_64BIT)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/helper.c"
                    ,0x1ded,
                    "void define_one_arm_cp_reg_with_opaque_arm(ARMCPU *, const ARMCPRegInfo *, void *)"
                   );
    }
  }
  else if (r->state == 0) {
    if (r->opc0 != '\0') {
      __assert_fail("(r->state != ARM_CP_STATE_AA32) || (r->opc0 == 0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/helper.c"
                    ,0x1deb,
                    "void define_one_arm_cp_reg_with_opaque_arm(ARMCPU *, const ARMCPRegInfo *, void *)"
                   );
    }
    goto LAB_00580f58;
  }
  if (7 < bVar1) {
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/helper.c"
                  ,0x1e13,
                  "void define_one_arm_cp_reg_with_opaque_arm(ARMCPU *, const ARMCPRegInfo *, void *)"
                 );
  }
  if ((*(uint *)(&DAT_00d6a1c4 + (ulong)bVar1 * 4) & r->access) != 0) {
    __assert_fail("(r->access & ~mask) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/helper.c"
                  ,0x1e17,
                  "void define_one_arm_cp_reg_with_opaque_arm(ARMCPU *, const ARMCPRegInfo *, void *)"
                 );
  }
LAB_00580f58:
  if ((uVar11 & 3) == 0) {
    if (((((char)r->access < '\0') && (r->fieldoffset == 0)) &&
        ((r->bank_fieldoffsets[0] == 0 || (r->bank_fieldoffsets[1] == 0)))) &&
       (r->readfn == (CPReadFn *)0x0)) {
      __assert_fail("(r->fieldoffset || (r->bank_fieldoffsets[0] && r->bank_fieldoffsets[1])) || r->readfn"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/helper.c"
                    ,0x1e22,
                    "void define_one_arm_cp_reg_with_opaque_arm(ARMCPU *, const ARMCPRegInfo *, void *)"
                   );
    }
    if ((((r->access & 0x40U) != 0) && (r->fieldoffset == 0)) &&
       (((r->bank_fieldoffsets[0] == 0 || (r->bank_fieldoffsets[1] == 0)) &&
        (r->writefn == (CPWriteFn *)0x0)))) {
      __assert_fail("(r->fieldoffset || (r->bank_fieldoffsets[0] && r->bank_fieldoffsets[1])) || r->writefn"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/helper.c"
                    ,0x1e27,
                    "void define_one_arm_cp_reg_with_opaque_arm(ARMCPU *, const ARMCPRegInfo *, void *)"
                   );
    }
  }
  if (((uVar11 & 0xfffe0f00) != 0) && (((uVar11 & 1) == 0 || (0x501 < (int)(uVar11 & 0xfffe0f00)))))
  {
    __assert_fail("cptype_valid(r->type)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/helper.c"
                  ,0x1e2b,
                  "void define_one_arm_cp_reg_with_opaque_arm(ARMCPU *, const ARMCPRegInfo *, void *)"
                 );
  }
  if (crm <= uVar4) {
    do {
      uVar11 = uVar5;
      if (uVar5 <= uVar10) {
        do {
          opc2 = uVar9;
          if (uVar9 <= uVar6) {
            do {
              iVar7 = 0;
              bVar12 = true;
              do {
                bVar3 = bVar12;
                if (r->state == iVar7 || r->state == 2) {
                  if (!bVar3) {
                    add_cpreg_to_hashtable(cpu,r,opaque,1,2,crm,uVar11,opc2,r->name);
                    break;
                  }
                  iVar7 = r->secure;
                  pcVar8 = r->name;
                  if (1 < iVar7 - 1U) {
                    pcVar8 = g_strdup_printf("%s_S",pcVar8);
                    add_cpreg_to_hashtable(cpu,r,opaque,0,1,crm,uVar11,opc2,pcVar8);
                    g_free(pcVar8);
                    iVar7 = 2;
                    pcVar8 = r->name;
                  }
                  add_cpreg_to_hashtable(cpu,r,opaque,0,iVar7,crm,uVar11,opc2,pcVar8);
                }
                iVar7 = 1;
                bVar12 = false;
              } while (bVar3);
              bVar12 = opc2 != uVar6;
              opc2 = opc2 + 1;
            } while (bVar12);
          }
          bVar12 = uVar11 != uVar10;
          uVar11 = uVar11 + 1;
        } while (bVar12);
      }
      bVar12 = crm != uVar4;
      crm = crm + 1;
    } while (bVar12);
  }
  return;
}

Assistant:

void define_one_arm_cp_reg_with_opaque(ARMCPU *cpu,
                                       const ARMCPRegInfo *r, void *opaque)
{
    /* Define implementations of coprocessor registers.
     * We store these in a hashtable because typically
     * there are less than 150 registers in a space which
     * is 16*16*16*8*8 = 262144 in size.
     * Wildcarding is supported for the crm, opc1 and opc2 fields.
     * If a register is defined twice then the second definition is
     * used, so this can be used to define some generic registers and
     * then override them with implementation specific variations.
     * At least one of the original and the second definition should
     * include ARM_CP_OVERRIDE in its type bits -- this is just a guard
     * against accidental use.
     *
     * The state field defines whether the register is to be
     * visible in the AArch32 or AArch64 execution state. If the
     * state is set to ARM_CP_STATE_BOTH then we synthesise a
     * reginfo structure for the AArch32 view, which sees the lower
     * 32 bits of the 64 bit register.
     *
     * Only registers visible in AArch64 may set r->opc0; opc0 cannot
     * be wildcarded. AArch64 registers are always considered to be 64
     * bits; the ARM_CP_64BIT* flag applies only to the AArch32 view of
     * the register, if any.
     */
    int crm, opc1, opc2, state;
    int crmmin = (r->crm == CP_ANY) ? 0 : r->crm;
    int crmmax = (r->crm == CP_ANY) ? 15 : r->crm;
    int opc1min = (r->opc1 == CP_ANY) ? 0 : r->opc1;
    int opc1max = (r->opc1 == CP_ANY) ? 7 : r->opc1;
    int opc2min = (r->opc2 == CP_ANY) ? 0 : r->opc2;
    int opc2max = (r->opc2 == CP_ANY) ? 7 : r->opc2;
    /* 64 bit registers have only CRm and Opc1 fields */
    assert(!((r->type & ARM_CP_64BIT) && (r->opc2 || r->crn)));
    /* op0 only exists in the AArch64 encodings */
    assert((r->state != ARM_CP_STATE_AA32) || (r->opc0 == 0));
    /* AArch64 regs are all 64 bit so ARM_CP_64BIT is meaningless */
    assert((r->state != ARM_CP_STATE_AA64) || !(r->type & ARM_CP_64BIT));
    /* The AArch64 pseudocode CheckSystemAccess() specifies that op1
     * encodes a minimum access level for the register. We roll this
     * runtime check into our general permission check code, so check
     * here that the reginfo's specified permissions are strict enough
     * to encompass the generic architectural permission check.
     */
#ifndef NDEBUG
    if (r->state != ARM_CP_STATE_AA32) {
        int mask = 0;
        switch (r->opc1) {
        case 0:
            /* min_EL EL1, but some accessible to EL0 via kernel ABI */
            mask = PL0U_R | PL1_RW;
            break;
        case 1: case 2:
            /* min_EL EL1 */
            mask = PL1_RW;
            break;
        case 3:
            /* min_EL EL0 */
            mask = PL0_RW;
            break;
        case 4:
        case 5:
            /* min_EL EL2 */
            mask = PL2_RW;
            break;
        case 6:
            /* min_EL EL3 */
            mask = PL3_RW;
            break;
        case 7:
            /* min_EL EL1, secure mode only (we don't check the latter) */
            mask = PL1_RW;
            break;
        default:
            /* broken reginfo with out-of-range opc1 */
            assert(false);
            break;
        }
        /* assert our permissions are not too lax (stricter is fine) */
        assert((r->access & ~mask) == 0);
    }
#endif

    /* Check that the register definition has enough info to handle
     * reads and writes if they are permitted.
     */
    if (!(r->type & (ARM_CP_SPECIAL|ARM_CP_CONST))) {
        if (r->access & PL3_R) {
            assert((r->fieldoffset ||
                   (r->bank_fieldoffsets[0] && r->bank_fieldoffsets[1])) ||
                   r->readfn);
        }
        if (r->access & PL3_W) {
            assert((r->fieldoffset ||
                   (r->bank_fieldoffsets[0] && r->bank_fieldoffsets[1])) ||
                   r->writefn);
        }
    }
    /* Bad type field probably means missing sentinel at end of reg list */
    assert(cptype_valid(r->type));
    for (crm = crmmin; crm <= crmmax; crm++) {
        for (opc1 = opc1min; opc1 <= opc1max; opc1++) {
            for (opc2 = opc2min; opc2 <= opc2max; opc2++) {
                for (state = ARM_CP_STATE_AA32;
                     state <= ARM_CP_STATE_AA64; state++) {
                    if (r->state != state && r->state != ARM_CP_STATE_BOTH) {
                        continue;
                    }
                    if (state == ARM_CP_STATE_AA32) {
                        /* Under AArch32 CP registers can be common
                         * (same for secure and non-secure world) or banked.
                         */
                        char *name;

                        switch (r->secure) {
                        case ARM_CP_SECSTATE_S:
                        case ARM_CP_SECSTATE_NS:
                            add_cpreg_to_hashtable(cpu, r, opaque, state,
                                                   r->secure, crm, opc1, opc2,
                                                   r->name);
                            break;
                        default:
                            name = g_strdup_printf("%s_S", r->name);
                            add_cpreg_to_hashtable(cpu, r, opaque, state,
                                                   ARM_CP_SECSTATE_S,
                                                   crm, opc1, opc2, name);
                            g_free(name);
                            add_cpreg_to_hashtable(cpu, r, opaque, state,
                                                   ARM_CP_SECSTATE_NS,
                                                   crm, opc1, opc2, r->name);
                            break;
                        }
                    } else {
                        /* AArch64 registers get mapped to non-secure instance
                         * of AArch32 */
                        add_cpreg_to_hashtable(cpu, r, opaque, state,
                                               ARM_CP_SECSTATE_NS,
                                               crm, opc1, opc2, r->name);
                    }
                }
            }
        }
    }
}